

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O0

Number __thiscall rc::Random::next(Random *this)

{
  Random *this_00;
  reference pvVar1;
  size_type in_RDI;
  size_t blki;
  Block *in_stack_00000068;
  Random *in_stack_00000070;
  
  this_00 = (Random *)(*(ulong *)(in_RDI + 0x48) & 3);
  if (this_00 == (Random *)0x0) {
    mash(in_stack_00000070,in_stack_00000068);
  }
  if (*(long *)(in_RDI + 0x48) == -1) {
    append(this_00,SUB81(in_RDI >> 0x38,0));
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  else {
    *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
  }
  pvVar1 = std::array<unsigned_long,_4UL>::operator[](&this_00->m_key,in_RDI);
  return *pvVar1;
}

Assistant:

Random::Number Random::next() {
  std::size_t blki = m_counter % std::tuple_size<Block>::value;
  if (blki == 0) {
    mash(m_block);
  }

  if (m_counter == kCounterMax) {
    append(true);
    m_counter = 0;
  } else {
    m_counter++;
  }

  return m_block[blki];
}